

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O3

Int128 * __thiscall
clickhouse::ColumnDecimal::At(Int128 *__return_storage_ptr__,ColumnDecimal *this,size_t i)

{
  long lVar1;
  Type *pTVar2;
  Code CVar3;
  ColumnVector<int> *pCVar4;
  ColumnVector<long> *pCVar5;
  ColumnVector<absl::int128> *pCVar6;
  int *piVar7;
  long *plVar8;
  int128 *piVar9;
  Int128 *pIVar10;
  __weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  ColumnVector<int> *pCVar12;
  ColumnVector<long> *pCVar13;
  ColumnVector<absl::int128> *pCVar14;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  lVar1 = *(long *)((long)&__return_storage_ptr__[2].v_ + 8);
  pTVar2 = *(Type **)(lVar1 + 0x18);
  p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
  }
  CVar3 = Type::GetCode(pTVar2);
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  lVar1 = *(long *)((long)&__return_storage_ptr__[2].v_ + 8);
  if (CVar3 == Int32) {
    std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<clickhouse::Column,void>
              ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 8));
    if (local_30 == 0) {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pCVar12 = (ColumnVector<int> *)0x0;
    }
    else {
      pCVar4 = (ColumnVector<int> *)
               __dynamic_cast(local_30,&Column::typeinfo,&ColumnVector<int>::typeinfo,0);
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pCVar12 = (ColumnVector<int> *)0x0;
      if (pCVar4 != (ColumnVector<int> *)0x0) {
        pCVar12 = pCVar4;
        if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var11 = local_28;
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_28->_M_use_count = local_28->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_28->_M_use_count = local_28->_M_use_count + 1;
          }
        }
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    piVar7 = ColumnVector<int>::At(pCVar12,(size_t)this);
    pIVar10 = (Int128 *)(long)*piVar7;
  }
  else {
    pTVar2 = *(Type **)(lVar1 + 0x18);
    p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    CVar3 = Type::GetCode(pTVar2);
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    __r = (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
          (*(long *)((long)&__return_storage_ptr__[2].v_ + 8) + 8);
    if (CVar3 == Int64) {
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::Column,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_30,__r);
      if (local_30 == 0) {
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar13 = (ColumnVector<long> *)0x0;
      }
      else {
        pCVar5 = (ColumnVector<long> *)
                 __dynamic_cast(local_30,&Column::typeinfo,&ColumnVector<long>::typeinfo,0);
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar13 = (ColumnVector<long> *)0x0;
        if (pCVar5 != (ColumnVector<long> *)0x0) {
          pCVar13 = pCVar5;
          if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var11 = local_28;
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_28->_M_use_count = local_28->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_28->_M_use_count = local_28->_M_use_count + 1;
            }
          }
        }
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      plVar8 = ColumnVector<long>::At(pCVar13,(size_t)this);
      pIVar10 = (Int128 *)*plVar8;
    }
    else {
      std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<clickhouse::Column,void>
                ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_30,__r);
      if (local_30 == 0) {
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar14 = (ColumnVector<absl::int128> *)0x0;
      }
      else {
        pCVar6 = (ColumnVector<absl::int128> *)
                 __dynamic_cast(local_30,&Column::typeinfo,&ColumnVector<absl::int128>::typeinfo,0);
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar14 = (ColumnVector<absl::int128> *)0x0;
        if (pCVar6 != (ColumnVector<absl::int128> *)0x0) {
          pCVar14 = pCVar6;
          if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var11 = local_28;
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_28->_M_use_count = local_28->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_28->_M_use_count = local_28->_M_use_count + 1;
            }
          }
        }
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      piVar9 = ColumnVector<absl::int128>::At(pCVar14,(size_t)this);
      pIVar10 = *(Int128 **)&piVar9->v_;
    }
  }
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  return pIVar10;
}

Assistant:

Int128 ColumnDecimal::At(size_t i) const {
    if (data_->Type()->GetCode() == Type::Int32) {
        return static_cast<Int128>(data_->As<ColumnInt32>()->At(i));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        return static_cast<Int128>(data_->As<ColumnInt64>()->At(i));
    } else {
        return data_->As<ColumnInt128>()->At(i);
    }
}